

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

Bool IsValidMediaExtension(ctmbstr sType)

{
  Bool BVar1;
  int iVar2;
  uint maxExt;
  long lVar3;
  tmbchar ext [20];
  
  BVar1 = IsFilePath(sType);
  if (BVar1 == no) {
    BVar1 = no;
  }
  else {
    GetFileExtension(sType,ext,maxExt);
    lVar3 = 0;
    do {
      if (lVar3 == 0x48) {
        return no;
      }
      iVar2 = prvTidytmbstrcasecmp
                        (ext,(ctmbstr)((long)&mediaExtensions_rel +
                                      (long)*(int *)((long)&mediaExtensions_rel + lVar3)));
      lVar3 = lVar3 + 4;
    } while (iVar2 != 0);
    BVar1 = yes;
  }
  return BVar1;
}

Assistant:

static Bool IsValidMediaExtension( ctmbstr sType )
{
    uint i;
    tmbchar ext[20];

    if ( !IsFilePath(sType) ) return 0;

    GetFileExtension( sType, ext, sizeof(ext) );

    for (i = 0; i < N_MEDIA_EXTS; i++)
    {
        if ( TY_(tmbstrcasecmp)(ext, mediaExtensions[i]) == 0 )
            return yes;
    }
    return no;
}